

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  char cVar1;
  pointer pbVar2;
  pointer pcVar3;
  text *ptVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined8 uVar8;
  runtime_error *this;
  long *plVar9;
  long *plVar10;
  bool bVar11;
  _Alloc_hider _Var12;
  bool bVar13;
  undefined1 uVar14;
  pointer __rhs;
  undefined1 uVar15;
  text val;
  text opt;
  texts in;
  int local_1fc;
  bool local_1f8;
  bool local_1f0;
  bool local_1e8;
  bool local_1e0;
  bool local_1d8;
  bool local_1d0;
  seed_t local_1b8;
  bool local_1b0;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  char *local_188;
  undefined8 local_180;
  char local_178 [16];
  undefined8 local_168;
  undefined8 local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_138;
  text local_130;
  text local_110;
  text local_f0;
  text local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  text local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs == pbVar2) {
    local_1fc = 1;
    local_1f8 = false;
    bVar11 = false;
    bVar6 = false;
    uVar14 = false;
    uVar15 = false;
    bVar13 = false;
    local_1b0 = false;
    local_1b8 = 0;
    local_1e8 = false;
    local_1f0 = false;
    local_1e0 = false;
    local_1d8 = false;
    local_1d0 = false;
  }
  else {
    local_1fc = 1;
    bVar11 = true;
    local_1d0 = false;
    local_1d8 = false;
    local_1e0 = false;
    local_1f0 = false;
    local_1e8 = false;
    local_1b8 = 0;
    local_1b0 = false;
    bVar13 = false;
    local_168 = 0;
    local_160 = 0;
    bVar6 = false;
    bVar5 = false;
    local_1f8 = false;
    local_138 = __return_storage_ptr__;
    do {
      if (bVar11) {
        local_188 = local_178;
        local_180 = 0;
        local_178[0] = '\0';
        local_1a8 = local_198;
        local_1a0 = 0;
        local_198[0] = 0;
        pcVar3 = (__rhs->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar3,pcVar3 + __rhs->_M_string_length);
        split_option((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,&local_70);
        std::__cxx11::string::operator=((string *)&local_188,(string *)local_90);
        std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_b0);
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        cVar1 = *local_188;
        if (cVar1 == '-') {
          iVar7 = std::__cxx11::string::compare((char *)&local_188);
          if (iVar7 == 0) goto LAB_0010918c;
          iVar7 = std::__cxx11::string::compare((char *)&local_188);
          if (iVar7 == 0) {
LAB_00109190:
            local_1d0 = true;
LAB_001091c4:
            bVar11 = true;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)&local_188);
            if (iVar7 == 0) goto LAB_00109190;
            iVar7 = std::__cxx11::string::compare((char *)&local_188);
            if (iVar7 == 0) {
LAB_00109199:
              local_1d8 = true;
              goto LAB_001091c4;
            }
            iVar7 = std::__cxx11::string::compare((char *)&local_188);
            if (iVar7 == 0) goto LAB_00109199;
            iVar7 = std::__cxx11::string::compare((char *)&local_188);
            if (iVar7 == 0) {
LAB_001091a2:
              local_1e0 = true;
              goto LAB_001091c4;
            }
            iVar7 = std::__cxx11::string::compare((char *)&local_188);
            if (iVar7 == 0) goto LAB_001091a2;
            iVar7 = std::__cxx11::string::compare((char *)&local_188);
            if (iVar7 == 0) {
LAB_001091ab:
              local_1e8 = true;
              goto LAB_001091c4;
            }
            iVar7 = std::__cxx11::string::compare((char *)&local_188);
            if (iVar7 == 0) goto LAB_001091ab;
            iVar7 = std::__cxx11::string::compare((char *)&local_188);
            if (iVar7 == 0) {
LAB_001091b4:
              local_1f0 = true;
              goto LAB_001091c4;
            }
            iVar7 = std::__cxx11::string::compare((char *)&local_188);
            if (iVar7 == 0) goto LAB_001091b4;
            iVar7 = std::__cxx11::string::compare((char *)&local_188);
            if (iVar7 == 0) {
LAB_001091bd:
              local_1f8 = true;
              goto LAB_001091c4;
            }
            iVar7 = std::__cxx11::string::compare((char *)&local_188);
            if (iVar7 == 0) goto LAB_001091bd;
            iVar7 = std::__cxx11::string::compare((char *)&local_188);
            bVar11 = true;
            if (iVar7 != 0) {
              iVar7 = std::__cxx11::string::compare((char *)&local_188);
              if (iVar7 == 0) goto LAB_0010922b;
              iVar7 = std::__cxx11::string::compare((char *)&local_188);
              if (iVar7 != 0) {
                iVar7 = std::__cxx11::string::compare((char *)&local_188);
                if (iVar7 == 0) goto LAB_00109234;
                iVar7 = std::__cxx11::string::compare((char *)&local_188);
                if (iVar7 == 0) {
LAB_0010923c:
                  bVar13 = true;
                  goto LAB_001091c4;
                }
                iVar7 = std::__cxx11::string::compare((char *)&local_188);
                if (iVar7 == 0) goto LAB_0010923c;
                iVar7 = std::__cxx11::string::compare((char *)&local_188);
                bVar11 = true;
                if (iVar7 != 0) {
                  iVar7 = std::__cxx11::string::compare((char *)&local_188);
                  if (iVar7 == 0) {
                    iVar7 = std::__cxx11::string::compare((char *)&local_1a8);
                    if (iVar7 == 0) goto LAB_001091c7;
                  }
                  iVar7 = std::__cxx11::string::compare((char *)&local_188);
                  if (iVar7 != 0) {
LAB_00109082:
                    iVar7 = std::__cxx11::string::compare((char *)&local_188);
                    if (iVar7 == 0) {
                      uVar8 = std::__cxx11::string::compare((char *)&local_1a8);
                      if ((int)uVar8 == 0) {
                        local_168 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
                        goto LAB_001091c4;
                      }
                    }
                    iVar7 = std::__cxx11::string::compare((char *)&local_188);
                    if (iVar7 == 0) {
                      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_d0,"--random-seed","");
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_f0,local_1a8,local_1a8 + local_1a0);
                      local_1b8 = seed(&local_d0,&local_f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p);
                      }
                      ptVar4 = &local_d0;
                      _Var12._M_p = local_d0._M_dataplus._M_p;
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare((char *)&local_188);
                      if (iVar7 != 0) {
                        this = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::operator+(&local_50,"unrecognised option \'",__rhs);
                        plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
                        local_b0 = (long *)*plVar9;
                        plVar10 = plVar9 + 2;
                        if (local_b0 == plVar10) {
                          local_a0 = *plVar10;
                          lStack_98 = plVar9[3];
                          local_b0 = &local_a0;
                        }
                        else {
                          local_a0 = *plVar10;
                        }
                        local_a8 = plVar9[1];
                        *plVar9 = (long)plVar10;
                        plVar9[1] = 0;
                        *(undefined1 *)(plVar9 + 2) = 0;
                        std::runtime_error::runtime_error(this,(string *)&local_b0);
                        __cxa_throw(this,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_110,"--repeat","");
                      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_130,local_1a8,local_1a8 + local_1a0);
                      local_1fc = repeat(&local_110,&local_130);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_130._M_dataplus._M_p != &local_130.field_2) {
                        operator_delete(local_130._M_dataplus._M_p);
                      }
                      ptVar4 = &local_110;
                      _Var12._M_p = local_110._M_dataplus._M_p;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var12._M_p != &ptVar4->field_2) {
                      operator_delete(_Var12._M_p);
                    }
                    goto LAB_001091c7;
                  }
                  uVar8 = std::__cxx11::string::compare((char *)&local_1a8);
                  if ((int)uVar8 != 0) goto LAB_00109082;
                  local_160 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
                  goto LAB_001091c4;
                }
                local_1b0 = true;
                goto LAB_001091c7;
              }
LAB_00109234:
              bVar6 = true;
              goto LAB_001091c4;
            }
LAB_0010922b:
            bVar5 = true;
          }
        }
        else {
LAB_0010918c:
          bVar11 = false;
        }
LAB_001091c7:
        if (local_1a8 != local_198) {
          operator_delete(local_1a8);
        }
        if (local_188 != local_178) {
          operator_delete(local_188);
        }
        if (cVar1 != '-') goto LAB_00109209;
      }
      else {
        bVar11 = false;
LAB_00109209:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_158,__rhs);
      }
      __rhs = __rhs + 1;
    } while (__rhs != pbVar2);
    bVar11 = true;
    if (!bVar5) {
      bVar11 = bVar6;
    }
    uVar15 = (undefined1)local_168;
    uVar14 = (undefined1)local_160;
    __return_storage_ptr__ = local_138;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__return_storage_ptr__,&local_158);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.help = local_1d0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.abort = local_1d8;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.count = local_1e0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.list = local_1f0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.tags = local_1e8;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.time = local_1f8;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.pass = bVar11;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.zen = bVar6;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.lexical = (bool)uVar14;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.random = (bool)uVar15;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.verbose = bVar13;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.version = local_1b0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.repeat = local_1fc;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.seed = local_1b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  return __return_storage_ptr__;
}

Assistant:

inline auto split_arguments( texts args ) -> std::tuple<options, texts>
{
    options option; texts in;

    bool in_options = true;

    for ( auto & arg : args )
    {
        if ( in_options )
        {
            text opt, val;
            std::tie( opt, val ) = split_option( arg );

            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + arg + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_tuple( option, in );
}